

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall kratos::Generator::clear_remove_stmt_cache(Generator *this)

{
  unordered_set<std::shared_ptr<kratos::Stmt>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  *this_00;
  key_type *pkVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  iterator iVar4;
  long lVar5;
  pointer __k;
  iterator iVar6;
  long lVar7;
  pointer __k_00;
  key_type *__k_01;
  
  __k = (this->stmts_).
        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pkVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pkVar1 - (long)__k;
  iVar6._M_current = pkVar1;
  if (0 < lVar5 >> 6) {
    this_00 = &this->stmts_remove_cache_;
    lVar7 = (lVar5 >> 6) + 1;
    __k_00 = __k;
    do {
      iVar4 = std::
              _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,__k_00);
      __k = __k_00;
      if (iVar4.super__Node_iterator_base<std::shared_ptr<kratos::Stmt>,_false>._M_cur !=
          (__node_type *)0x0) goto LAB_00173c6d;
      iVar4 = std::
              _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,__k_00 + 1);
      __k = __k_00 + 1;
      if (iVar4.super__Node_iterator_base<std::shared_ptr<kratos::Stmt>,_false>._M_cur !=
          (__node_type *)0x0) goto LAB_00173c6d;
      iVar4 = std::
              _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,__k_00 + 2);
      __k = __k_00 + 2;
      if (iVar4.super__Node_iterator_base<std::shared_ptr<kratos::Stmt>,_false>._M_cur !=
          (__node_type *)0x0) goto LAB_00173c6d;
      iVar4 = std::
              _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,__k_00 + 3);
      __k = __k_00 + 3;
      if (iVar4.super__Node_iterator_base<std::shared_ptr<kratos::Stmt>,_false>._M_cur !=
          (__node_type *)0x0) goto LAB_00173c6d;
      __k = __k_00 + 4;
      lVar7 = lVar7 + -1;
      lVar5 = lVar5 + -0x40;
      __k_00 = __k;
    } while (1 < lVar7);
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 == 1) {
LAB_00173c50:
    iVar4 = std::
            _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->stmts_remove_cache_)._M_h,__k);
    if (iVar4.super__Node_iterator_base<std::shared_ptr<kratos::Stmt>,_false>._M_cur ==
        (__node_type *)0x0) {
      __k = pkVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_00173c1f:
    iVar4 = std::
            _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->stmts_remove_cache_)._M_h,__k);
    if (iVar4.super__Node_iterator_base<std::shared_ptr<kratos::Stmt>,_false>._M_cur ==
        (__node_type *)0x0) {
      __k = __k + 1;
      goto LAB_00173c50;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_00173cc5;
    iVar4 = std::
            _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->stmts_remove_cache_)._M_h,__k);
    if (iVar4.super__Node_iterator_base<std::shared_ptr<kratos::Stmt>,_false>._M_cur ==
        (__node_type *)0x0) {
      __k = __k + 1;
      goto LAB_00173c1f;
    }
  }
LAB_00173c6d:
  if ((__k != pkVar1) && (__k_01 = __k + 1, iVar6._M_current = __k, __k_01 != pkVar1)) {
    do {
      iVar4 = std::
              _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->stmts_remove_cache_)._M_h,__k_01);
      if (iVar4.super__Node_iterator_base<std::shared_ptr<kratos::Stmt>,_false>._M_cur ==
          (__node_type *)0x0) {
        peVar2 = (__k_01->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var3 = (__k_01->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        (__k_01->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (__k_01->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_01 = (__k->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
        (__k->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
        (__k->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             p_Var3;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        __k = __k + 1;
      }
      __k_01 = __k_01 + 1;
      iVar6._M_current = __k;
    } while (__k_01 != pkVar1);
  }
LAB_00173cc5:
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  _M_erase(&this->stmts_,iVar6,
           (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->stmts_remove_cache_)._M_h);
  return;
}

Assistant:

void Generator::clear_remove_stmt_cache() {
    stmts_.erase(std::remove_if(stmts_.begin(), stmts_.end(),
                                [this](auto const &stmt) {
                                    return stmts_remove_cache_.find(stmt) !=
                                           stmts_remove_cache_.end();
                                }),
                 stmts_.end());

    stmts_remove_cache_.clear();
}